

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O1

value_reference_type __thiscall
pstore::index::
hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
::iterator_base<true>::operator*(iterator_base<true> *this)

{
  database_reference pdVar1;
  pair<const_pstore::uint128,_pstore::extent<unsigned_char>_> *ppVar2;
  pair<const_pstore::uint128,_pstore::extent<unsigned_char>_> *ppVar3;
  database_reader *archive;
  database_reference local_48;
  value_type local_40;
  pair<pstore::uint128,_pstore::extent<unsigned_char>_> local_38;
  
  if ((this->pos_)._M_t.
      super___uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_*,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_>_>
      .
      super__Head_base<0UL,_std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_*,_false>
      ._M_head_impl == (pair<const_pstore::uint128,_pstore::extent<unsigned_char>_> *)0x0) {
    pdVar1 = this->db_;
    local_40 = (value_type)get_address(this);
    local_48 = pdVar1;
    serialize::
    read<std::pair<pstore::uint128,pstore::extent<unsigned_char>>,pstore::serialize::archive::database_reader>
              (&local_38,(serialize *)&local_48,archive);
    ppVar3 = (pair<const_pstore::uint128,_pstore::extent<unsigned_char>_> *)operator_new(0x20);
    *(undefined8 *)&(ppVar3->first).v_ = (undefined8)local_38.first.v_;
    *(undefined8 *)((long)&(ppVar3->first).v_ + 8) = local_38.first.v_._8_8_;
    (ppVar3->second).addr.a_.a_ = (value_type)local_38.second.addr.a_.a_;
    (ppVar3->second).size = local_38.second.size;
    ppVar2 = (this->pos_)._M_t.
             super___uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_*,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_>_>
             .
             super__Head_base<0UL,_std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_*,_false>
             ._M_head_impl;
    (this->pos_)._M_t.
    super___uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_*,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_>_>
    .
    super__Head_base<0UL,_std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_*,_false>
    ._M_head_impl = ppVar3;
    if (ppVar2 != (pair<const_pstore::uint128,_pstore::extent<unsigned_char>_> *)0x0) {
      operator_delete(ppVar2,0x20);
    }
  }
  return (this->pos_)._M_t.
         super___uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_*,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_>_>
         .
         super__Head_base<0UL,_std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_*,_false>
         ._M_head_impl;
}

Assistant:

value_reference_type operator* () const {
                    if (pos_ == nullptr) {
                        pos_ = std::make_unique<value_type> (
                            index_->load_leaf_node (db_, this->get_address ()));
                    }
                    return *pos_;
                }